

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O1

FSerializer *
Serialize<FLinePortal,FLinePortal>
          (FSerializer *arc,char *key,TArray<FLinePortal,_FLinePortal> *value,
          TArray<FLinePortal,_FLinePortal> *param_4)

{
  bool bVar1;
  uint amount;
  ulong uVar2;
  long lVar3;
  
  if ((arc->w == (FWriter *)0x0) || (value->Count != 0)) {
    bVar1 = FSerializer::BeginArray(arc,key);
    if (arc->r != (FReader *)0x0) {
      if (!bVar1) {
        if (value->Count == 0) {
          return arc;
        }
        value->Count = 0;
        return arc;
      }
      amount = FSerializer::ArraySize(arc);
      TArray<FLinePortal,_FLinePortal>::Resize(value,amount);
    }
    if (value->Count != 0) {
      lVar3 = 0;
      uVar2 = 0;
      do {
        Serialize(arc,(char *)0x0,(FLinePortal *)((long)&value->Array->mOrigin + lVar3),
                  (FLinePortal *)param_4);
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0x48;
      } while (uVar2 < value->Count);
    }
    FSerializer::EndArray(arc);
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, TArray<T, TT> &value, TArray<T, TT> *)
{
	if (arc.isWriting())
	{
		if (value.Size() == 0) return arc;	// do not save empty arrays
	}
	bool res = arc.BeginArray(key);
	if (arc.isReading())
	{
		if (!res)
		{
			value.Clear();
			return arc;
		}
		value.Resize(arc.ArraySize());
	}
	for (unsigned i = 0; i < value.Size(); i++)
	{
		Serialize(arc, nullptr, value[i], (T*)nullptr);
	}
	arc.EndArray();
	return arc;
}